

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

ssize_t __thiscall
ritobin::io::text_write_impl::TextWriter::write(TextWriter *this,int __fd,void *__buf,size_t __n)

{
  const_reference pvVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ulong local_20;
  size_t i;
  array<float,_16UL> *value_local;
  TextWriter *this_local;
  
  ident_inc(this);
  write_raw<3ul>(this,(char (*) [3])"{\n");
  pad(this);
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    pvVar1 = std::array<float,_16UL>::operator[]
                       ((array<float,_16UL> *)CONCAT44(in_register_00000034,__fd),local_20);
    write<float>(this,*pvVar1);
    if ((local_20 & 3) == 3) {
      write_raw<2ul>(this,(char (*) [2])0x1d9c21);
      if (local_20 == 0xf) {
        ident_dec(this);
      }
      pad(this);
    }
    else {
      write_raw<3ul>(this,(char (*) [3])", ");
    }
  }
  write_raw<2ul>(this,(char (*) [2])0x1d182f);
  return extraout_RAX;
}

Assistant:

void write(std::array<float, 16> const& value) noexcept {
            ident_inc();
            write_raw("{\n");
            pad();
            for (size_t i = 0; i < 16; i++) {
                write(value[i]);
                if (i % 4 == 3) {
                    write_raw("\n");
                    if (i == 15) {
                        ident_dec();
                    }
                    pad();
                } else {
                    write_raw(", ");
                }
            }
            write_raw("}");
        }